

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  bool bVar1;
  Type TVar2;
  long *plVar3;
  Descriptor *pDVar4;
  undefined8 uVar5;
  FieldDescriptor *in_RDX;
  FieldDescriptor *in_RSI;
  undefined8 *in_RDI;
  MessageLite *prototype;
  Extension *extension;
  FieldDescriptor *in_stack_fffffffffffffeb0;
  FieldDescriptor *in_stack_fffffffffffffec0;
  Extension **in_stack_fffffffffffffed8;
  FieldDescriptor *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffeec;
  ExtensionSet *in_stack_fffffffffffffef0;
  undefined8 *local_28;
  MessageLite *local_8;
  
  FieldDescriptor::number(in_RSI);
  bVar1 = MaybeNewExtension(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,
                            in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  if (bVar1) {
    TVar2 = FieldDescriptor::type(in_stack_fffffffffffffec0);
    *(char *)(local_28 + 1) = (char)TVar2;
    *(undefined1 *)((long)local_28 + 9) = 0;
    *(undefined1 *)((long)local_28 + 0xb) = 0;
    pDVar4 = FieldDescriptor::message_type(in_stack_fffffffffffffeb0);
    plVar3 = (long *)(**(code **)(*(long *)in_RDX + 0x10))(in_RDX,pDVar4);
    *(byte *)((long)local_28 + 10) = *(byte *)((long)local_28 + 10) & 0xf;
    uVar5 = (**(code **)(*plVar3 + 0x20))(plVar3,*in_RDI);
    *local_28 = uVar5;
    *(byte *)((long)local_28 + 10) = *(byte *)((long)local_28 + 10) & 0xf0;
    local_8 = (MessageLite *)*local_28;
  }
  else {
    *(byte *)((long)local_28 + 10) = *(byte *)((long)local_28 + 10) & 0xf0;
    if ((*(byte *)((long)local_28 + 10) >> 4 & 1) == 0) {
      local_8 = (MessageLite *)*local_28;
    }
    else {
      plVar3 = (long *)*local_28;
      pDVar4 = FieldDescriptor::message_type(in_RDX);
      uVar5 = (**(code **)(*(long *)in_RDX + 0x10))(in_RDX,pDVar4);
      local_8 = (MessageLite *)(**(code **)(*plVar3 + 0x20))(plVar3,uVar5);
    }
  }
  return local_8;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_packed = false;
    const MessageLite* prototype =
        factory->GetPrototype(descriptor->message_type());
    extension->is_lazy = false;
    extension->message_value = prototype->New(arena_);
    extension->is_cleared = false;
    return extension->message_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->lazymessage_value->MutableMessage(
          *factory->GetPrototype(descriptor->message_type()));
    } else {
      return extension->message_value;
    }
  }
}